

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::Shutdown(Connection *this)

{
  bool bVar1;
  char *source;
  Connection *in_RDI;
  SessionIncoming *in_stack_00000028;
  SessionOutgoing *in_stack_00000078;
  UDPAddress *in_stack_000000a0;
  Connection *in_stack_000000a8;
  nullptr_t in_stack_ffffffffffffff38;
  basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>
  *in_stack_ffffffffffffff40;
  ErrorType in_stack_ffffffffffffff4c;
  string *desc;
  Result *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff84;
  RefCounter *in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [32];
  undefined8 local_30;
  undefined4 local_24;
  string *local_20;
  char *local_18;
  string *local_10;
  RefCounter *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Tonk shutdown",(allocator *)&stack0xffffffffffffff8f);
  desc = local_50;
  local_18 = "Connection::Shutdown";
  local_20 = local_70;
  local_24 = 0;
  local_30 = 0xc;
  local_10 = desc;
  source = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            ((ErrorResult *)in_RDI,source,desc,in_stack_ffffffffffffff4c,
             (ErrorCodeT)in_stack_ffffffffffffff40);
  *(char **)desc = source;
  RefCounter::StartShutdown
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  Result::~Result((Result *)in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  reportClose(in_RDI);
  removeFromMaps(in_stack_000000a8);
  if ((in_RDI->Deps).DisconnectHandler != (FloodDetector *)0x0) {
    FloodDetector::OnDisconnect((FloodDetector *)in_stack_000000a8,in_stack_000000a0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                      *)0x19d929);
  if (bVar1) {
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x19d940);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                        *)0x19d94c);
    if (bVar1) {
      std::
      unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
      operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x19d963);
      std::
      unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      ::operator->((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                    *)0x19d96f);
      asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>::cancel
                (in_stack_ffffffffffffff40);
      std::
      unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
      operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x19d988);
      std::
      unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      ::operator=((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                   *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::
      unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
      operator=((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator=((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *)
            in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::operator=((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::operator=
            ((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SessionIncoming::Shutdown(in_stack_00000028);
  SessionOutgoing::Shutdown(in_stack_00000078);
  local_8 = (in_RDI->Deps).SocketRefCount;
  std::__atomic_base<int>::operator--(&(local_8->RefCount).super___atomic_base<int>);
  return;
}

Assistant:

void Connection::Shutdown()
{
    TONK_DEBUG_ASSERT(!SelfRefCount.ObjectInUse());

    // Make sure that at least one Disconnect has occurred
    SelfRefCount.StartShutdown(
        Tonk_AppRequest,
        Result("Connection::Shutdown", "Tonk shutdown", ErrorType::Tonk, Tonk_AppRequest));

    reportClose();

    removeFromMaps();

    // If the flood detection subsystem needs to be notified of a disconnect:
    if (Deps.DisconnectHandler) {
        Deps.DisconnectHandler->OnDisconnect(Deps.DisconnectAddrKey);
    }

    if (ResolverState && ResolverState->Resolver)
    {
        ResolverState->Resolver->cancel();
        ResolverState->Resolver = nullptr;
        ResolverState = nullptr;
    }

    // Kill the strand
    AsioEventStrand = nullptr;
    Ticker = nullptr;
    HolePuncher = nullptr;

    // Shut down most connected objects first:

    Incoming.Shutdown();
    Outgoing.Shutdown();

#ifdef TONK_DETAILED_STATS

    Deets.WriteJsonToFile();
    Logger.Info("Detailed statistics consumed ", Deets.GetMemoryUsed(), " bytes");

#endif

    // Release reference to socket
    Deps.SocketRefCount->DecrementReferences();
}